

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O1

void __thiscall Assimp::Vertex::Vertex(Vertex *this,aiMesh *msh,uint idx)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  aiVector3D *paVar3;
  undefined8 uVar4;
  float fVar5;
  ulong uVar6;
  aiVector3D *paVar7;
  long lVar8;
  
  memset(this,0,0x90);
  this->colors[0].r = 0.0;
  this->colors[0].g = 0.0;
  this->colors[0].b = 0.0;
  this->colors[0].a = 0.0;
  this->colors[1].r = 0.0;
  this->colors[1].g = 0.0;
  this->colors[1].b = 0.0;
  this->colors[1].a = 0.0;
  this->colors[2].r = 0.0;
  this->colors[2].g = 0.0;
  this->colors[2].b = 0.0;
  this->colors[2].a = 0.0;
  this->colors[3].r = 0.0;
  this->colors[3].g = 0.0;
  this->colors[3].b = 0.0;
  this->colors[3].a = 0.0;
  this->colors[4].r = 0.0;
  this->colors[4].g = 0.0;
  this->colors[4].b = 0.0;
  this->colors[4].a = 0.0;
  this->colors[5].r = 0.0;
  this->colors[5].g = 0.0;
  this->colors[5].b = 0.0;
  this->colors[5].a = 0.0;
  this->colors[6].r = 0.0;
  this->colors[6].g = 0.0;
  this->colors[6].b = 0.0;
  this->colors[6].a = 0.0;
  this->colors[7].r = 0.0;
  this->colors[7].g = 0.0;
  this->colors[7].b = 0.0;
  this->colors[7].a = 0.0;
  if (msh->mNumVertices <= idx) {
    __assert_fail("idx < msh->mNumVertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/Vertex.h"
                  ,0x74,"Assimp::Vertex::Vertex(const aiMesh *, unsigned int)");
  }
  paVar7 = msh->mVertices;
  uVar6 = (ulong)idx;
  (this->position).z = paVar7[uVar6].z;
  paVar7 = paVar7 + uVar6;
  fVar5 = paVar7->y;
  (this->position).x = paVar7->x;
  (this->position).y = fVar5;
  paVar7 = msh->mNormals;
  if ((paVar7 != (aiVector3D *)0x0) && (msh->mNumVertices != 0)) {
    (this->normal).z = paVar7[uVar6].z;
    fVar5 = paVar7[uVar6].y;
    (this->normal).x = paVar7[uVar6].x;
    (this->normal).y = fVar5;
  }
  paVar7 = msh->mTangents;
  if (((paVar7 != (aiVector3D *)0x0) && (msh->mBitangents != (aiVector3D *)0x0)) &&
     (msh->mNumVertices != 0)) {
    (this->tangent).z = paVar7[uVar6].z;
    fVar5 = paVar7[uVar6].y;
    (this->tangent).x = paVar7[uVar6].x;
    (this->tangent).y = fVar5;
    paVar7 = msh->mBitangents;
    (this->bitangent).z = paVar7[uVar6].z;
    paVar7 = paVar7 + uVar6;
    fVar5 = paVar7->y;
    (this->bitangent).x = paVar7->x;
    (this->bitangent).y = fVar5;
  }
  paVar7 = this->texcoords;
  lVar8 = 0;
  do {
    if ((msh->mTextureCoords[lVar8] == (aiVector3D *)0x0) || (msh->mNumVertices == 0)) break;
    paVar3 = msh->mTextureCoords[lVar8];
    paVar7->z = paVar3[uVar6].z;
    paVar3 = paVar3 + uVar6;
    fVar5 = paVar3->y;
    paVar7->x = paVar3->x;
    paVar7->y = fVar5;
    lVar8 = lVar8 + 1;
    paVar7 = paVar7 + 1;
  } while (lVar8 != 8);
  lVar8 = 0;
  while( true ) {
    if (*(long *)((long)msh->mColors + lVar8) == 0) {
      return;
    }
    if (msh->mNumVertices == 0) break;
    puVar1 = (undefined8 *)(*(long *)((long)msh->mColors + lVar8) + uVar6 * 0x10);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)((long)&this->colors[0].r + lVar8 * 2);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    lVar8 = lVar8 + 8;
    if (lVar8 == 0x40) {
      return;
    }
  }
  return;
}

Assistant:

explicit Vertex(const aiMesh* msh, unsigned int idx) {
        ai_assert(idx < msh->mNumVertices);
        position = msh->mVertices[idx];

        if (msh->HasNormals()) {
            normal = msh->mNormals[idx];
        }

        if (msh->HasTangentsAndBitangents()) {
            tangent = msh->mTangents[idx];
            bitangent = msh->mBitangents[idx];
        }

        for (unsigned int i = 0; msh->HasTextureCoords(i); ++i) {
            texcoords[i] = msh->mTextureCoords[i][idx];
        }

        for (unsigned int i = 0; msh->HasVertexColors(i); ++i) {
            colors[i] = msh->mColors[i][idx];
        }
    }